

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::EnumValueName_abi_cxx11_
                   (EnumValueDescriptor *descriptor)

{
  EnumValueDescriptor *in_RSI;
  string *in_RDI;
  string name;
  string value_str;
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator *paVar1;
  string *__lhs;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [24];
  EnumDescriptor *in_stack_ffffffffffffff78;
  string local_80 [32];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  string local_30 [7];
  undefined1 in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  
  __lhs = in_RDI;
  EnumValueDescriptor::type(in_RSI);
  EnumName_abi_cxx11_(in_stack_ffffffffffffff78);
  EnumValueDescriptor::name_abi_cxx11_(in_RSI);
  anon_unknown_0::UnderscoresToCamelCase(in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(__lhs,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_a0);
  paVar1 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"",paVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff18,"_Value",(allocator *)&stack0xffffffffffffff17);
  anon_unknown_0::SanitizeNameForObjC
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string EnumValueName(const EnumValueDescriptor* descriptor) {
  // Because of the Switch enum compatibility, the name on the enum has to have
  // the suffix handing, so it slightly diverges from how nested classes work.
  //   enum Fixed {
  //     FOO = 1
  //   }
  // yields Fixed_Enum and Fixed_Enum_Foo (not Fixed_Foo).
  const string class_name = EnumName(descriptor->type());
  const string value_str = UnderscoresToCamelCase(descriptor->name(), true);
  const string name = class_name + "_" + value_str;
  // There aren't really any reserved words with an underscore and a leading
  // capital letter, but playing it safe and checking.
  return SanitizeNameForObjC("", name, "_Value", NULL);
}